

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::WriteParamSymbols
          (CWriter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *index_to_name)

{
  uint uVar1;
  Index IVar2;
  const_reference pvVar3;
  Newline local_41;
  ParamName local_40 [2];
  string_view local_30;
  uint local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  Index i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *index_to_name_local;
  CWriter *this_local;
  
  pvStack_18 = index_to_name;
  index_to_name_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  IVar2 = Func::GetNumParams(this->func_);
  if (IVar2 != 0) {
    Indent(this,4);
    local_1c = 0;
    while( true ) {
      uVar1 = local_1c;
      IVar2 = Func::GetNumParams(this->func_);
      if (IVar2 <= uVar1) break;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,", ");
      Write(this,local_30);
      if ((local_1c != 0) && ((local_1c & 7) == 0)) {
        Write(this);
      }
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_18,(ulong)local_1c);
      ParamName::LocalName(local_40,pvVar3);
      Write(this,local_40);
      local_1c = local_1c + 1;
    }
    Dedent(this,4);
  }
  (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [3])0x239d95,&local_41);
  return;
}

Assistant:

void CWriter::WriteParamSymbols(const std::vector<std::string>& index_to_name) {
  if (func_->GetNumParams() != 0) {
    Indent(4);
    for (Index i = 0; i < func_->GetNumParams(); ++i) {
      Write(", ");
      if (i != 0 && (i % 8) == 0) {
        Write(Newline());
      }
      Write(ParamName(index_to_name[i]));
    }
    Dedent(4);
  }
  Write(");", Newline());
}